

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOfPdu.cpp
# Opt level: O0

void __thiscall DIS::IsGroupOfPdu::IsGroupOfPdu(IsGroupOfPdu *this)

{
  IsGroupOfPdu *this_local;
  
  EntityManagementFamilyPdu::EntityManagementFamilyPdu(&this->super_EntityManagementFamilyPdu);
  (this->super_EntityManagementFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__IsGroupOfPdu_00272510;
  EntityID::EntityID(&this->_groupEntityID);
  this->_groupedEntityCategory = '\0';
  this->_numberOfGroupedEntities = '\0';
  this->_pad2 = 0;
  this->_latitude = 0.0;
  this->_longitude = 0.0;
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::vector
            (&this->_groupedEntityDescriptions);
  Pdu::setPduType((Pdu *)this,'\"');
  return;
}

Assistant:

IsGroupOfPdu::IsGroupOfPdu() : EntityManagementFamilyPdu(),
   _groupEntityID(), 
   _groupedEntityCategory(0), 
   _numberOfGroupedEntities(0), 
   _pad2(0), 
   _latitude(0.0), 
   _longitude(0.0)
{
    setPduType( 34 );
}